

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

xmlPatParserContextPtr xmlNewPatParserContext(xmlChar *pattern,xmlDictPtr dict,xmlChar **namespaces)

{
  xmlChar *pxVar1;
  xmlPatParserContextPtr pxVar2;
  int iVar3;
  xmlChar **ppxVar4;
  
  if (pattern != (xmlChar *)0x0) {
    pxVar2 = (xmlPatParserContextPtr)(*xmlMalloc)(0x40);
    if (pxVar2 == (xmlPatParserContextPtr)0x0) {
      pxVar2 = (xmlPatParserContextPtr)0x0;
    }
    else {
      *(undefined8 *)&pxVar2->error = 0;
      pxVar2->dict = (xmlDictPtr)0x0;
      pxVar2->namespaces = (xmlChar **)0x0;
      *(undefined8 *)&pxVar2->nb_namespaces = 0;
      pxVar2->comp = (xmlPatternPtr)0x0;
      pxVar2->elem = (xmlNodePtr)0x0;
      pxVar2->dict = dict;
      pxVar2->cur = pattern;
      pxVar2->base = pattern;
      if (namespaces != (xmlChar **)0x0) {
        iVar3 = -1;
        ppxVar4 = namespaces;
        do {
          iVar3 = iVar3 + 1;
          pxVar1 = *ppxVar4;
          ppxVar4 = ppxVar4 + 2;
        } while (pxVar1 != (xmlChar *)0x0);
        pxVar2->nb_namespaces = iVar3;
      }
      pxVar2->namespaces = namespaces;
    }
    return pxVar2;
  }
  return (xmlPatParserContextPtr)0x0;
}

Assistant:

static xmlPatParserContextPtr
xmlNewPatParserContext(const xmlChar *pattern, xmlDictPtr dict,
                       const xmlChar **namespaces) {
    xmlPatParserContextPtr cur;

    if (pattern == NULL)
        return(NULL);

    cur = (xmlPatParserContextPtr) xmlMalloc(sizeof(xmlPatParserContext));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewPatParserContext : malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlPatParserContext));
    cur->dict = dict;
    cur->cur = pattern;
    cur->base = pattern;
    if (namespaces != NULL) {
        int i;
        for (i = 0;namespaces[2 * i] != NULL;i++)
            ;
        cur->nb_namespaces = i;
    } else {
        cur->nb_namespaces = 0;
    }
    cur->namespaces = namespaces;
    return(cur);
}